

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Articulated_Parts_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Articulated_Parts_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  VariableParameter *pVVar3;
  string local_200 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
  local_1e0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Articulated_Parts_PDU *local_18;
  Articulated_Parts_PDU *this_local;
  
  local_18 = this;
  this_local = (Articulated_Parts_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  LE_Header::GetAsString_abi_cxx11_(&local_1c0,&this->super_LE_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Articulated Parts PDU-\n");
  poVar2 = std::operator<<(poVar2,"Number Of Variable Params: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumOfVariableParams);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
            ::begin(&this->m_vVariableParameters);
  local_1e0._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
       ::end(&this->m_vVariableParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1e0);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
              ::operator*(&citrEnd);
    pVVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::operator->(this_00);
    (*(pVVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_200);
    std::operator<<(local_190,local_200);
    std::__cxx11::string::~string(local_200);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Articulated_Parts_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Articulated Parts PDU-\n"
       << "Number Of Variable Params: " << ( KUINT16 )m_ui8NumOfVariableParams << "\n";

    // Variable params
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}